

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O0

void Rwr_ScoresClean(Rwr_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  int local_28;
  int local_24;
  int k;
  int i;
  Rwr_Node_t *pNode;
  Vec_Ptr_t *vSubgraphs;
  Rwr_Man_t *p_local;
  
  for (local_24 = 0; local_24 < p->vClasses->nSize; local_24 = local_24 + 1) {
    p_00 = Vec_VecEntry(p->vClasses,local_24);
    for (local_28 = 0; iVar1 = Vec_PtrSize(p_00), local_28 < iVar1; local_28 = local_28 + 1) {
      pvVar2 = Vec_PtrEntry(p_00,local_28);
      *(undefined2 *)((long)pvVar2 + 0xc) = 0;
      *(undefined2 *)((long)pvVar2 + 10) = 0;
      *(undefined2 *)((long)pvVar2 + 8) = 0;
    }
  }
  return;
}

Assistant:

void Rwr_ScoresClean( Rwr_Man_t * p )
{
    Vec_Ptr_t * vSubgraphs;
    Rwr_Node_t * pNode;
    int i, k;
    for ( i = 0; i < p->vClasses->nSize; i++ )
    {
        vSubgraphs = Vec_VecEntry( p->vClasses, i );
        Vec_PtrForEachEntry( Rwr_Node_t *, vSubgraphs, pNode, k )
            pNode->nScore = pNode->nGain = pNode->nAdded = 0;
    }
}